

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O2

void __thiscall deqp::egl::ApiCase::expectError(ApiCase *this,EGLenum expected)

{
  ostringstream *this_00;
  TestContext *this_01;
  Library *pLVar1;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  MessageBuilder local_1a8;
  
  pLVar1 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_1c8.m_value = (*pLVar1->_vptr_Library[0x1f])(pLVar1);
  if (local_1c8.m_value != expected) {
    local_1a8.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &local_1a8.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"// ERROR expected: ");
    local_1b8.m_getName = eglu::getErrorName;
    local_1b8.m_value = expected;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::operator<<((ostream *)this_00,", Got: ");
    local_1c8.m_getName = eglu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)this_00);
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Got invalid error");
    }
  }
  return;
}

Assistant:

void ApiCase::expectError (EGLenum expected)
{
	EGLenum err = m_eglTestCtx.getLibrary().getError();
	if (err != expected)
	{
		m_testCtx.getLog() << TestLog::Message << "// ERROR expected: " << eglu::getErrorStr(expected) << ", Got: " << eglu::getErrorStr(err) << TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid error");
	}
}